

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  tar *tar_00;
  int64_t iVar1;
  tar *tar;
  int64_t bytes_skipped;
  archive_read *a_local;
  
  tar_00 = (tar *)a->format->data;
  iVar1 = __archive_read_consume
                    (a,tar_00->entry_bytes_remaining + tar_00->entry_padding +
                       tar_00->entry_bytes_unconsumed);
  if (iVar1 < 0) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    tar_00->entry_bytes_remaining = 0;
    tar_00->entry_bytes_unconsumed = 0;
    tar_00->entry_padding = 0;
    gnu_clear_sparse_list(tar_00);
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    tar->entry_bytes_remaining + tar->entry_padding +
	    tar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}